

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ThreadedSectionInfo::~ThreadedSectionInfo(ThreadedSectionInfo *this)

{
  ThreadedSectionInfo *in_RDI;
  
  ~ThreadedSectionInfo(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

ThreadedSectionInfo::~ThreadedSectionInfo() {}